

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O1

bool __thiscall
loader::context_t::driverSorting
          (context_t *this,driver_vector_t *drivers,ze_init_driver_type_desc_t *desc,bool sysmanOnly
          )

{
  zel_driver_type_t zVar1;
  pointer pdVar2;
  size_t sVar3;
  size_t __n;
  ze_driver_handle_t p_Var4;
  ze_device_handle_t p_Var5;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  __first;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  __last;
  long lVar6;
  zel_driver_type_t __val;
  size_type sVar7;
  driver_vector_t *pdVar8;
  int iVar9;
  ze_result_t zVar10;
  uint uVar11;
  long *plVar12;
  undefined8 *puVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long *plVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  size_type *psVar19;
  ze_result_t result;
  ze_result_t result_00;
  ze_result_t result_01;
  ze_result_t result_02;
  ze_result_t result_03;
  ze_result_t result_04;
  ze_result_t result_05;
  ze_result_t result_06;
  ze_result_t result_07;
  ze_result_t result_08;
  ze_result_t result_09;
  driver_t *coreDriver;
  pointer pdVar20;
  pointer pdVar21;
  uint uVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  ze_driver_handle_t *pp_Var25;
  pointer pp_Var26;
  bool bVar27;
  string message_13;
  ze_driver_properties_t properties;
  uint32_t pCount;
  vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> deviceHandles;
  uint32_t deviceCount;
  vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> driverHandles;
  string message;
  ze_init_driver_type_desc_t permissiveDesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  ze_driver_properties_t local_658;
  uint32_t local_62c;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  uint local_5e4;
  uint local_5e0;
  uint32_t local_5dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d8;
  uint local_5cc;
  vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_> local_5c8;
  pointer local_5b0;
  undefined1 local_5a8 [24];
  ulong uStack_590;
  ze_init_driver_type_desc_t local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  ze_driver_handle_t *local_1f8;
  driver_vector_t *local_1f0;
  ze_driver_properties_t *local_1e8;
  pointer local_1e0;
  ze_init_driver_type_desc_t *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_5b0 = (pointer)CONCAT44(local_5b0._4_4_,(int)CONCAT71(in_register_00000009,sysmanOnly));
  local_438.stype = ZE_STRUCTURE_TYPE_INIT_DRIVER_TYPE_DESC;
  local_438._4_4_ = 0;
  local_438.pNext = (void *)0x0;
  local_438.flags = 0xffffffff;
  local_438._20_4_ = 0;
  pdVar21 = (drivers->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (drivers->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  local_1f0 = drivers;
  local_1d8 = desc;
  if (pdVar21 != local_1e0) {
    do {
      if ((char)local_5b0 != '\0') {
        pdVar20 = (this->zeDrivers).
                  super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar2 = (this->zeDrivers).
                 super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar20 != pdVar2) {
          sVar3 = (pdVar21->name)._M_string_length;
          do {
            while( true ) {
              __n = (pdVar20->name)._M_string_length;
              if (__n == sVar3) {
                if (__n == 0) {
                  bVar27 = true;
                }
                else {
                  iVar9 = bcmp((pdVar20->name)._M_dataplus._M_p,(pdVar21->name)._M_dataplus._M_p,__n
                              );
                  bVar27 = iVar9 == 0;
                }
              }
              else {
                bVar27 = false;
              }
              if (!bVar27) break;
              if ((pdVar21->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0) {
                (pdVar21->dditable).ze.Global.pfnInitDrivers =
                     (pdVar20->dditable).ze.Global.pfnInitDrivers;
              }
              if ((pdVar21->dditable).ze.Driver.pfnGet == (ze_pfnDriverGet_t)0x0) {
                (pdVar21->dditable).ze.Driver.pfnGet = (pdVar20->dditable).ze.Driver.pfnGet;
              }
              if ((pdVar21->dditable).ze.Driver.pfnGetProperties == (ze_pfnDriverGetProperties_t)0x0
                 ) {
                (pdVar21->dditable).ze.Driver.pfnGetProperties =
                     (pdVar20->dditable).ze.Driver.pfnGetProperties;
              }
              if ((pdVar21->dditable).ze.Device.pfnGet == (ze_pfnDeviceGet_t)0x0) {
                (pdVar21->dditable).ze.Device.pfnGet = (pdVar20->dditable).ze.Device.pfnGet;
              }
              if ((pdVar21->dditable).ze.Device.pfnGetProperties == (ze_pfnDeviceGetProperties_t)0x0
                 ) {
                (pdVar21->dditable).ze.Device.pfnGetProperties =
                     (pdVar20->dditable).ze.Device.pfnGetProperties;
              }
              pdVar20 = pdVar20 + 1;
              if (bVar27 || pdVar20 == pdVar2) goto LAB_0017d574;
            }
            pdVar20 = pdVar20 + 1;
          } while (pdVar20 != pdVar2);
        }
      }
LAB_0017d574:
      local_62c = 0;
      local_5c8.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (ze_driver_handle_t *)0x0;
      local_5c8.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ze_driver_handle_t *)0x0;
      local_5c8.super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((local_1d8 == (ze_init_driver_type_desc_t *)0x0) ||
         ((pdVar21->dditable).ze.Global.pfnInitDrivers == (ze_pfnInitDrivers_t)0x0)) {
        if ((pdVar21->dditable).ze.Driver.pfnGet == (ze_pfnDriverGet_t)0x0) {
          if (this->debugTraceEnabled != true) goto LAB_0017f115;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_658,"driverSorting ",&pdVar21->name);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
          local_5a8._0_8_ = local_5a8 + 0x10;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar15) {
            local_5a8._16_8_ = paVar15->_M_allocated_capacity;
            uStack_590 = puVar13[3];
          }
          else {
            local_5a8._16_8_ = paVar15->_M_allocated_capacity;
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_5a8._8_8_ = puVar13[1];
          *puVar13 = paVar15;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_658.uuid) {
            operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
          }
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_378,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
          to_string_abi_cxx11_(&local_110,(loader *)0x0,result_01);
          debug_trace_message(this,&local_378,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          uVar23 = local_378.field_2._M_allocated_capacity;
          _Var24._M_p = local_378._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p == &local_378.field_2) goto LAB_0017f0f8;
LAB_0017f0f0:
          operator_delete(_Var24._M_p,uVar23 + 1);
        }
        else {
          if ((pdVar21->initStatus == ZE_RESULT_SUCCESS) && (pdVar21->legacyInitAttempted != false))
          {
            if (this->debugTraceEnabled == true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_658,"driverSorting ",&pdVar21->name);
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 == paVar15) {
                local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                uStack_590 = puVar13[3];
                local_5a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_5a8 + 0x10);
              }
              else {
                local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                local_5a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar13;
              }
              local_5a8._8_8_ = puVar13[1];
              *puVar13 = paVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_658.uuid) {
                operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
              }
              local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_318,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
              debug_trace_message(this,&local_318,&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_5a8 + 0x10)) {
                operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
              }
            }
            zVar10 = (*(pdVar21->dditable).ze.Driver.pfnGet)(&local_62c,(ze_driver_handle_t *)0x0);
            if (zVar10 == ZE_RESULT_SUCCESS) {
              std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                        (&local_5c8,(ulong)local_62c);
              zVar10 = (*(pdVar21->dditable).ze.Driver.pfnGet)
                                 (&local_62c,
                                  local_5c8.
                                  super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
              if (zVar10 == ZE_RESULT_SUCCESS) goto LAB_0017e157;
              if (this->debugTraceEnabled == true) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_658,"driverSorting ",&pdVar21->name);
                puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
                local_5a8._0_8_ = local_5a8 + 0x10;
                paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar13 == paVar15) {
                  local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                  uStack_590 = puVar13[3];
                }
                else {
                  local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                  local_5a8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar13;
                }
                local_5a8._8_8_ = puVar13[1];
                *puVar13 = paVar15;
                puVar13[1] = 0;
                *(undefined1 *)(puVar13 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_658.uuid) {
                  operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
                }
                local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_358,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
                to_string_abi_cxx11_(&local_f0,(loader *)(ulong)zVar10,result_09);
                debug_trace_message(this,&local_358,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                uVar23 = local_358.field_2._M_allocated_capacity;
                _Var24._M_p = local_358._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_358._M_dataplus._M_p != &local_358.field_2) goto LAB_0017f0f0;
                goto LAB_0017f0f8;
              }
            }
            else if (this->debugTraceEnabled == true) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_658,"driverSorting ",&pdVar21->name);
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
              local_5a8._0_8_ = local_5a8 + 0x10;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 == paVar15) {
                local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                uStack_590 = puVar13[3];
              }
              else {
                local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                local_5a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar13;
              }
              local_5a8._8_8_ = puVar13[1];
              *puVar13 = paVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&local_658.uuid) {
                operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
              }
              local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_338,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
              to_string_abi_cxx11_(&local_d0,(loader *)(ulong)zVar10,result_07);
              debug_trace_message(this,&local_338,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              uVar23 = local_338.field_2._M_allocated_capacity;
              _Var24._M_p = local_338._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != &local_338.field_2) goto LAB_0017f0f0;
              goto LAB_0017f0f8;
            }
            goto LAB_0017f115;
          }
          if (this->debugTraceEnabled != true) goto LAB_0017f115;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_658,"driverSorting ",&pdVar21->name);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
          local_5a8._0_8_ = local_5a8 + 0x10;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar15) {
            local_5a8._16_8_ = paVar15->_M_allocated_capacity;
            uStack_590 = puVar13[3];
          }
          else {
            local_5a8._16_8_ = paVar15->_M_allocated_capacity;
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_5a8._8_8_ = puVar13[1];
          *puVar13 = paVar15;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_658.uuid) {
            operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
          }
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
          to_string_abi_cxx11_(&local_b0,(loader *)(ulong)pdVar21->initStatus,result);
          debug_trace_message(this,&local_2f8,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          uVar23 = local_2f8.field_2._M_allocated_capacity;
          _Var24._M_p = local_2f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) goto LAB_0017f0f0;
        }
LAB_0017f0f8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_5a8 + 0x10)) {
          operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
        }
      }
      else {
        if (pdVar21->initDriversStatus != ZE_RESULT_SUCCESS) {
          if (this->debugTraceEnabled == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_658,"driverSorting ",&pdVar21->name);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_658);
            local_5a8._0_8_ = local_5a8 + 0x10;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar15) {
              local_5a8._16_8_ = paVar15->_M_allocated_capacity;
              uStack_590 = plVar12[3];
            }
            else {
              local_5a8._16_8_ = paVar15->_M_allocated_capacity;
              local_5a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar12;
            }
            local_5a8._8_8_ = plVar12[1];
            *plVar12 = (long)paVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_658._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&local_658.uuid) {
              operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
            }
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_278,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
            to_string_abi_cxx11_(&local_50,(loader *)(ulong)pdVar21->initDriversStatus,result_00);
            debug_trace_message(this,&local_278,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar23 = local_278.field_2._M_allocated_capacity;
            _Var24._M_p = local_278._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) goto LAB_0017f0f0;
            goto LAB_0017f0f8;
          }
          goto LAB_0017f115;
        }
        paVar15 = &local_678.field_2;
        if (this->debugTraceEnabled == true) {
          std::operator+(&local_608,"driverSorting ",&pdVar21->name);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
          plVar16 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar16) {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678.field_2._8_8_ = plVar12[3];
            local_678._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_678._M_string_length = plVar12[1];
          *plVar12 = (long)plVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          to_string_abi_cxx11_
                    (&local_628,(loader *)&local_438,
                     (ze_init_driver_type_desc_t *)local_678._M_string_length);
          uVar23 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            uVar23 = local_678.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length)) {
            uVar23 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              uVar23 = local_628.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length))
            goto LAB_0017db49;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_628,0,(char *)0x0,(ulong)local_678._M_dataplus._M_p);
          }
          else {
LAB_0017db49:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_678,(ulong)local_628._M_dataplus._M_p);
          }
          local_658._0_8_ = &local_658.uuid;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658.uuid.id._8_8_ = puVar13[3];
          }
          else {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_658.pNext = (void *)puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          paVar17->_M_local_buf[0] = '\0';
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            uStack_590 = puVar13[3];
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_5a8 + 0x10);
          }
          else {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_5a8._8_8_ = puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_658.uuid) {
            operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p,
                            (ulong)(local_628.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            operator_delete(local_678._M_dataplus._M_p,
                            (ulong)(local_678.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          debug_trace_message(this,&local_298,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_5a8 + 0x10)) {
            operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
          }
        }
        local_62c = 0;
        zVar10 = (*(pdVar21->dditable).ze.Global.pfnInitDrivers)
                           (&local_62c,(ze_driver_handle_t *)0x0,&local_438);
        if (zVar10 != ZE_RESULT_SUCCESS) {
          if (this->debugTraceEnabled != true) goto LAB_0017f115;
          std::operator+(&local_608,"driverSorting ",&pdVar21->name);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
          paVar15 = &local_678.field_2;
          plVar16 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar16) {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678.field_2._8_8_ = plVar12[3];
            local_678._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_678._M_string_length = plVar12[1];
          *plVar12 = (long)plVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          to_string_abi_cxx11_
                    (&local_628,(loader *)&local_438,
                     (ze_init_driver_type_desc_t *)local_678._M_string_length);
          uVar23 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            uVar23 = local_678.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length)) {
            uVar23 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              uVar23 = local_628.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length))
            goto LAB_0017df0a;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_628,0,(char *)0x0,(ulong)local_678._M_dataplus._M_p);
          }
          else {
LAB_0017df0a:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_678,(ulong)local_628._M_dataplus._M_p);
          }
          local_658._0_8_ = &local_658.uuid;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658.uuid.id._8_8_ = puVar13[3];
          }
          else {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_658.pNext = (void *)puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          paVar17->_M_local_buf[0] = '\0';
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            uStack_590 = puVar13[3];
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_5a8 + 0x10);
          }
          else {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_5a8._8_8_ = puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_658.uuid) {
            operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p,
                            (ulong)(local_628.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            operator_delete(local_678._M_dataplus._M_p,
                            (ulong)(local_678.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
          to_string_abi_cxx11_(&local_70,(loader *)(ulong)zVar10,result_06);
          debug_trace_message(this,&local_2b8,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          uVar23 = local_2b8.field_2._M_allocated_capacity;
          _Var24._M_p = local_2b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_0017f0f0;
          goto LAB_0017f0f8;
        }
        std::vector<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>::resize
                  (&local_5c8,(ulong)local_62c);
        zVar10 = (*(pdVar21->dditable).ze.Global.pfnInitDrivers)
                           (&local_62c,
                            local_5c8.
                            super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,&local_438);
        if (zVar10 == ZE_RESULT_SUCCESS) {
LAB_0017e157:
          if (local_5c8.
              super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_5c8.
              super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_5d8 = &pdVar21->name;
            local_1e8 = &pdVar21->properties;
            local_1f8 = local_5c8.
                        super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            pp_Var25 = local_5c8.
                       super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pp_Var26 = local_5c8.
                       super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              p_Var4 = *pp_Var26;
              local_658.driverVersion = 0;
              local_658._36_4_ = 0;
              local_658.uuid.id[0] = '\0';
              local_658.uuid.id[1] = '\0';
              local_658.uuid.id[2] = '\0';
              local_658.uuid.id[3] = '\0';
              local_658.uuid.id[4] = '\0';
              local_658.uuid.id[5] = '\0';
              local_658.uuid.id[6] = '\0';
              local_658.uuid.id[7] = '\0';
              local_658.uuid.id[8] = '\0';
              local_658.uuid.id[9] = '\0';
              local_658.uuid.id[10] = '\0';
              local_658.uuid.id[0xb] = '\0';
              local_658.uuid.id[0xc] = '\0';
              local_658.uuid.id[0xd] = '\0';
              local_658.uuid.id[0xe] = '\0';
              local_658.uuid.id[0xf] = '\0';
              local_658._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1;
              local_658.pNext = (void *)0x0;
              zVar10 = (*(pdVar21->dditable).ze.Driver.pfnGetProperties)(p_Var4,&local_658);
              if (zVar10 == ZE_RESULT_SUCCESS) {
                local_1e8->driverVersion = local_658.driverVersion;
                *(undefined4 *)&local_1e8->field_0x24 = local_658._36_4_;
                *(undefined8 *)(local_1e8->uuid).id = local_658.uuid.id._0_8_;
                *(undefined8 *)((local_1e8->uuid).id + 8) = local_658.uuid.id._8_8_;
                local_1e8->stype = local_658.stype;
                *(undefined4 *)&local_1e8->field_0x4 = local_658._4_4_;
                local_1e8->pNext = local_658.pNext;
                local_5dc = 0;
                zVar10 = (*(pdVar21->dditable).ze.Device.pfnGet)
                                   (p_Var4,&local_5dc,(ze_device_handle_t *)0x0);
                if (zVar10 == ZE_RESULT_SUCCESS) {
                  if ((ulong)local_5dc == 0) {
                    if (this->debugTraceEnabled == true) {
                      std::operator+(&local_678,"driverSorting ",local_5d8);
                      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_678);
                      local_5a8._0_8_ = local_5a8 + 0x10;
                      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar13 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar13 == paVar15) {
                        local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                        uStack_590 = puVar13[3];
                      }
                      else {
                        local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                        local_5a8._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)*puVar13;
                      }
                      local_5a8._8_8_ = puVar13[1];
                      *puVar13 = paVar15;
                      puVar13[1] = 0;
                      *(undefined1 *)(puVar13 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_678._M_dataplus._M_p != &local_678.field_2) {
                        operator_delete(local_678._M_dataplus._M_p,
                                        (ulong)(local_678.field_2._M_allocated_capacity + 1));
                      }
                      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_3d8,local_5a8._0_8_,
                                 local_5a8._8_8_ + local_5a8._0_8_);
                      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
                      debug_trace_message(this,&local_3d8,&local_258);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_258._M_dataplus._M_p != &local_258.field_2) {
                        operator_delete(local_258._M_dataplus._M_p,
                                        local_258.field_2._M_allocated_capacity + 1);
                      }
                      uVar23 = local_3d8.field_2._M_allocated_capacity;
                      _Var24._M_p = local_3d8._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) goto LAB_0017e5f0;
                      goto LAB_0017e5f8;
                    }
                  }
                  else {
                    std::vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_>::
                    vector((vector<_ze_device_handle_t_*,_std::allocator<_ze_device_handle_t_*>_> *)
                           &local_628,(ulong)local_5dc,(allocator_type *)local_5a8);
                    zVar10 = (*(pdVar21->dditable).ze.Device.pfnGet)
                                       (p_Var4,&local_5dc,
                                        (ze_device_handle_t *)local_628._M_dataplus._M_p);
                    sVar7 = local_628._M_string_length;
                    if (zVar10 == ZE_RESULT_SUCCESS) {
                      if (local_628._M_dataplus._M_p == (pointer)local_628._M_string_length) {
                        uVar14 = 0;
                        uVar11 = 0;
                        uVar22 = 0;
                      }
                      else {
                        local_5e4 = 0;
                        local_5cc = 0;
                        local_5e0 = 0;
                        _Var24._M_p = local_628._M_dataplus._M_p;
                        do {
                          p_Var5 = *(ze_device_handle_t *)_Var24._M_p;
                          memset((ze_device_properties_t *)local_5a8,0,0x170);
                          local_5a8._0_4_ = 3;
                          local_5a8._8_8_ = (void *)0x0;
                          zVar10 = (*(pdVar21->dditable).ze.Device.pfnGetProperties)
                                             (p_Var5,(ze_device_properties_t *)local_5a8);
                          if (zVar10 == ZE_RESULT_SUCCESS) {
                            if (local_5a8._16_4_ == ZE_DEVICE_TYPE_GPU) {
                              bVar27 = (uStack_590 & 0x100000000) == 0;
                              local_5e0 = local_5e0 & 0xff;
                              if (bVar27) {
                                local_5e0 = 1;
                              }
                              local_5e4 = local_5e4 & 0xff;
                              if (!bVar27) {
                                local_5e4 = 1;
                              }
                            }
                            else {
                              local_5cc = 1;
                            }
                          }
                          else if (this->debugTraceEnabled == true) {
                            std::operator+(&local_608,"driverSorting ",local_5d8);
                            plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
                            local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
                            plVar16 = plVar12 + 2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar12 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)plVar16) {
                              local_678.field_2._M_allocated_capacity = *plVar16;
                              local_678.field_2._8_8_ = plVar12[3];
                            }
                            else {
                              local_678.field_2._M_allocated_capacity = *plVar16;
                              local_678._M_dataplus._M_p = (pointer)*plVar12;
                            }
                            local_678._M_string_length = plVar12[1];
                            *plVar12 = (long)plVar16;
                            plVar12[1] = 0;
                            *(undefined1 *)(plVar12 + 2) = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_608._M_dataplus._M_p != &local_608.field_2) {
                              operator_delete(local_608._M_dataplus._M_p,
                                              local_608.field_2._M_allocated_capacity + 1);
                            }
                            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_418,local_678._M_dataplus._M_p,
                                       local_678._M_dataplus._M_p +
                                       (long)(ze_structure_type_t *)local_678._M_string_length);
                            to_string_abi_cxx11_(&local_190,(loader *)(ulong)zVar10,result_04);
                            debug_trace_message(this,&local_418,&local_190);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
                              operator_delete(local_190._M_dataplus._M_p,
                                              local_190.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
                              operator_delete(local_418._M_dataplus._M_p,
                                              local_418.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_678._M_dataplus._M_p != &local_678.field_2) {
                              operator_delete(local_678._M_dataplus._M_p,
                                              (ulong)(local_678.field_2._M_allocated_capacity + 1));
                            }
                          }
                          _Var24._M_p = _Var24._M_p + 8;
                          uVar14 = local_5cc;
                          uVar11 = local_5e4;
                          uVar22 = local_5e0;
                        } while (_Var24._M_p != (pointer)sVar7);
                      }
                      pp_Var25 = local_1f8;
                      if ((uVar11 & 1) == 0) {
                        if ((uVar22 & 1) == 0) {
                          if ((uVar14 & 1) != 0) {
                            pdVar21->driverType = ZEL_DRIVER_TYPE_OTHER;
                          }
                        }
                        else {
                          pdVar21->driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                        }
                      }
                      else if ((uVar22 & 1) == 0) {
LAB_0017eaf4:
                        pdVar21->driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                      }
                      else if ((uVar14 & 1) == 0) {
                        if ((uVar22 & 1) == 0) goto LAB_0017eaf4;
                        pdVar21->driverType = ZEL_DRIVER_TYPE_GPU;
                      }
                      else {
                        pdVar21->driverType = ZEL_DRIVER_TYPE_MIXED;
                      }
                    }
                    else if (this->debugTraceEnabled == true) {
                      std::operator+(&local_678,"driverSorting ",local_5d8);
                      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_678);
                      local_5a8._0_8_ = local_5a8 + 0x10;
                      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar13 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar13 == paVar15) {
                        local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                        uStack_590 = puVar13[3];
                      }
                      else {
                        local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                        local_5a8._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)*puVar13;
                      }
                      local_5a8._8_8_ = puVar13[1];
                      *puVar13 = paVar15;
                      puVar13[1] = 0;
                      *(undefined1 *)(puVar13 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_678._M_dataplus._M_p != &local_678.field_2) {
                        operator_delete(local_678._M_dataplus._M_p,
                                        (ulong)(local_678.field_2._M_allocated_capacity + 1));
                      }
                      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_3f8,local_5a8._0_8_,
                                 local_5a8._8_8_ + local_5a8._0_8_);
                      to_string_abi_cxx11_(&local_170,(loader *)(ulong)zVar10,result_05);
                      debug_trace_message(this,&local_3f8,&local_170);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_170._M_dataplus._M_p != &local_170.field_2) {
                        operator_delete(local_170._M_dataplus._M_p,
                                        local_170.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                        operator_delete(local_3f8._M_dataplus._M_p,
                                        local_3f8.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5a8._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_5a8 + 0x10)) {
                        operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_628._M_dataplus._M_p !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      uVar18 = local_628.field_2._M_allocated_capacity -
                               (long)local_628._M_dataplus._M_p;
                      _Var24._M_p = local_628._M_dataplus._M_p;
                      goto LAB_0017e618;
                    }
                  }
                }
                else if (this->debugTraceEnabled == true) {
                  std::operator+(&local_678,"driverSorting ",local_5d8);
                  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_678);
                  local_5a8._0_8_ = local_5a8 + 0x10;
                  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar13 == paVar15) {
                    local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                    uStack_590 = puVar13[3];
                  }
                  else {
                    local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                    local_5a8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar13;
                  }
                  local_5a8._8_8_ = puVar13[1];
                  *puVar13 = paVar15;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_678._M_dataplus._M_p != &local_678.field_2) {
                    operator_delete(local_678._M_dataplus._M_p,
                                    (ulong)(local_678.field_2._M_allocated_capacity + 1));
                  }
                  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_3b8,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_)
                  ;
                  to_string_abi_cxx11_(&local_150,(loader *)(ulong)zVar10,result_03);
                  debug_trace_message(this,&local_3b8,&local_150);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_150._M_dataplus._M_p != &local_150.field_2) {
                    operator_delete(local_150._M_dataplus._M_p,
                                    local_150.field_2._M_allocated_capacity + 1);
                  }
                  uVar23 = local_3b8.field_2._M_allocated_capacity;
                  _Var24._M_p = local_3b8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) goto LAB_0017e5f0;
                  goto LAB_0017e5f8;
                }
              }
              else if (this->debugTraceEnabled == true) {
                std::operator+(&local_678,"driverSorting ",local_5d8);
                puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_678);
                local_5a8._0_8_ = local_5a8 + 0x10;
                paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar13 == paVar15) {
                  local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                  uStack_590 = puVar13[3];
                }
                else {
                  local_5a8._16_8_ = paVar15->_M_allocated_capacity;
                  local_5a8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar13;
                }
                local_5a8._8_8_ = puVar13[1];
                *puVar13 = paVar15;
                puVar13[1] = 0;
                *(undefined1 *)(puVar13 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p != &local_678.field_2) {
                  operator_delete(local_678._M_dataplus._M_p,
                                  (ulong)(local_678.field_2._M_allocated_capacity + 1));
                }
                local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_398,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
                to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar10,result_02);
                debug_trace_message(this,&local_398,&local_130);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                uVar23 = local_398.field_2._M_allocated_capacity;
                _Var24._M_p = local_398._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != &local_398.field_2) {
LAB_0017e5f0:
                  operator_delete(_Var24._M_p,uVar23 + 1);
                }
LAB_0017e5f8:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5a8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_5a8 + 0x10)) {
                  uVar18 = local_5a8._16_8_ + 1;
                  _Var24._M_p = (pointer)local_5a8._0_8_;
LAB_0017e618:
                  operator_delete(_Var24._M_p,uVar18);
                }
              }
              pp_Var26 = pp_Var26 + 1;
            } while (pp_Var26 != pp_Var25);
          }
        }
        else if (this->debugTraceEnabled == true) {
          std::operator+(&local_608,"driverSorting ",&pdVar21->name);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
          paVar15 = &local_678.field_2;
          plVar16 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar16) {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678.field_2._8_8_ = plVar12[3];
            local_678._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            local_678.field_2._M_allocated_capacity = *plVar16;
            local_678._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_678._M_string_length = plVar12[1];
          *plVar12 = (long)plVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          to_string_abi_cxx11_
                    (&local_628,(loader *)&local_438,
                     (ze_init_driver_type_desc_t *)local_678._M_string_length);
          uVar23 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            uVar23 = local_678.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length)) {
            uVar23 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              uVar23 = local_628.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < (char *)(local_628._M_string_length + local_678._M_string_length))
            goto LAB_0017ee3f;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_628,0,(char *)0x0,(ulong)local_678._M_dataplus._M_p);
          }
          else {
LAB_0017ee3f:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_678,(ulong)local_628._M_dataplus._M_p);
          }
          local_658._0_8_ = &local_658.uuid;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658.uuid.id._8_8_ = puVar13[3];
          }
          else {
            local_658.uuid.id._0_8_ = paVar17->_M_allocated_capacity;
            local_658._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_658.pNext = (void *)puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          paVar17->_M_local_buf[0] = '\0';
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_658);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 == paVar17) {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            uStack_590 = puVar13[3];
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_5a8 + 0x10);
          }
          else {
            local_5a8._16_8_ = paVar17->_M_allocated_capacity;
            local_5a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar13;
          }
          local_5a8._8_8_ = puVar13[1];
          *puVar13 = paVar17;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_658.uuid) {
            operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p,
                            (ulong)(local_628.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != paVar15) {
            operator_delete(local_678._M_dataplus._M_p,
                            (ulong)(local_678.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,local_5a8._0_8_,local_5a8._8_8_ + local_5a8._0_8_);
          to_string_abi_cxx11_(&local_90,(loader *)(ulong)zVar10,result_08);
          debug_trace_message(this,&local_2d8,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          uVar23 = local_2d8.field_2._M_allocated_capacity;
          _Var24._M_p = local_2d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) goto LAB_0017f0f0;
          goto LAB_0017f0f8;
        }
      }
LAB_0017f115:
      if (local_5c8.
          super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>._M_impl.
          super__Vector_impl_data._M_start != (ze_driver_handle_t *)0x0) {
        operator_delete(local_5c8.
                        super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_5c8.
                              super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5c8.
                              super__Vector_base<_ze_driver_handle_t_*,_std::allocator<_ze_driver_handle_t_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pdVar21 = pdVar21 + 1;
    } while (pdVar21 != local_1e0);
  }
  pdVar8 = local_1f0;
  __first._M_current =
       (local_1f0->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (local_1f0->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar18 = ((long)__last._M_current - (long)__first._M_current >> 3) * 0x7aff6957aff6957b;
    lVar6 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(loader::driver_t_const&,loader::driver_t_const&)>>
              (__first,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_loader::driver_t_&,_const_loader::driver_t_&)>)
               driverSortComparator);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<loader::driver_t*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(loader::driver_t_const&,loader::driver_t_const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_loader::driver_t_&,_const_loader::driver_t_&)>)
               driverSortComparator);
  }
  if (this->debugTraceEnabled != false) {
    local_5a8._0_8_ = local_5a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"Drivers after sorting:","")
    ;
    pdVar21 = (pdVar8->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
              _M_impl.super__Vector_impl_data._M_start;
    local_5b0 = (pdVar8->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    if (pdVar21 != local_5b0) {
      do {
        zVar1 = pdVar21->driverType;
        __val = -zVar1;
        if (0 < (int)zVar1) {
          __val = zVar1;
        }
        uVar22 = 1;
        if (9 < __val) {
          uVar18 = (ulong)__val;
          uVar14 = 4;
          do {
            uVar22 = uVar14;
            uVar11 = (uint)uVar18;
            if (uVar11 < 100) {
              uVar22 = uVar22 - 2;
              goto LAB_0017f25e;
            }
            if (uVar11 < 1000) {
              uVar22 = uVar22 - 1;
              goto LAB_0017f25e;
            }
            if (uVar11 < 10000) goto LAB_0017f25e;
            uVar18 = uVar18 / 10000;
            uVar14 = uVar22 + 4;
          } while (99999 < uVar11);
          uVar22 = uVar22 + 1;
        }
LAB_0017f25e:
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_628,(char)uVar22 - (char)((int)zVar1 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_628._M_dataplus._M_p + (zVar1 >> 0x1f),uVar22,__val);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,0x1cd948);
        psVar19 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608.field_2._8_8_ = plVar12[3];
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        }
        else {
          local_608.field_2._M_allocated_capacity = *psVar19;
          local_608._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_608._M_string_length = plVar12[1];
        *plVar12 = (long)psVar19;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
        plVar16 = plVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar16) {
          local_678.field_2._M_allocated_capacity = *plVar16;
          local_678.field_2._8_8_ = plVar12[3];
          local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
        }
        else {
          local_678.field_2._M_allocated_capacity = *plVar16;
          local_678._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_678._M_string_length = plVar12[1];
        *plVar12 = (long)plVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_678,(ulong)(pdVar21->name)._M_dataplus._M_p);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar15) {
          local_658.uuid.id._0_8_ = paVar15->_M_allocated_capacity;
          local_658.uuid.id._8_8_ = puVar13[3];
          local_658._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_658.uuid;
        }
        else {
          local_658.uuid.id._0_8_ = paVar15->_M_allocated_capacity;
          local_658._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_658.pNext = (void *)puVar13[1];
        *puVar13 = paVar15;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append(local_5a8,local_658._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&local_658.uuid) {
          operator_delete((void *)local_658._0_8_,local_658.uuid.id._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_dataplus._M_p != &local_678.field_2) {
          operator_delete(local_678._M_dataplus._M_p,
                          (ulong)(local_678.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) {
          operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p,
                          (ulong)(local_628.field_2._M_allocated_capacity + 1));
        }
        pdVar21 = pdVar21 + 1;
      } while (pdVar21 != local_5b0);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_5a8._0_8_,
               (undefined1 *)(local_5a8._8_8_ + local_5a8._0_8_));
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    debug_trace_message(this,&local_1b0,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_5a8._0_8_ != local_5a8 + 0x10) {
      operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
    }
  }
  return true;
}

Assistant:

bool context_t::driverSorting(driver_vector_t *drivers, ze_init_driver_type_desc_t* desc, bool sysmanOnly) {
        ze_init_driver_type_desc_t permissiveDesc = {};
        permissiveDesc.stype = ZE_STRUCTURE_TYPE_INIT_DRIVER_TYPE_DESC;
        permissiveDesc.pNext = nullptr;
        permissiveDesc.flags = UINT32_MAX;
        for (auto &driver : *drivers) {
            if (sysmanOnly) {
                for (auto &coreDriver : this->zeDrivers) {
                    if (coreDriver.name == driver.name) {
                        if (!driver.dditable.ze.Global.pfnInitDrivers) {
                            driver.dditable.ze.Global.pfnInitDrivers = coreDriver.dditable.ze.Global.pfnInitDrivers;
                        }
                        if (!driver.dditable.ze.Driver.pfnGet) {
                            driver.dditable.ze.Driver.pfnGet = coreDriver.dditable.ze.Driver.pfnGet;
                        }
                        if (!driver.dditable.ze.Driver.pfnGetProperties) {
                            driver.dditable.ze.Driver.pfnGetProperties = coreDriver.dditable.ze.Driver.pfnGetProperties;
                        }
                        if (!driver.dditable.ze.Device.pfnGet) {
                            driver.dditable.ze.Device.pfnGet = coreDriver.dditable.ze.Device.pfnGet;
                        }
                        if (!driver.dditable.ze.Device.pfnGetProperties) {
                            driver.dditable.ze.Device.pfnGetProperties = coreDriver.dditable.ze.Device.pfnGetProperties;
                        }
                        break;
                    }
                }
            }
            uint32_t pCount = 0;
            std::vector<ze_driver_handle_t> driverHandles;
            ze_result_t res = ZE_RESULT_SUCCESS;
            if (desc && driver.dditable.ze.Global.pfnInitDrivers) {
                if (driver.initDriversStatus != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInitDrivers returned ";
                        debug_trace_message(message, loader::to_string(driver.initDriversStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeInitDrivers(" + loader::to_string(&permissiveDesc) + ")";
                    debug_trace_message(message, "");
                }
                pCount = 0;
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, nullptr, &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                // Use the driver's init function to query the driver handles and read the properties.
                res = driver.dditable.ze.Global.pfnInitDrivers(&pCount, driverHandles.data(), &permissiveDesc);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeInitDrivers(" + loader::to_string(&permissiveDesc) + ") returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else if (driver.dditable.ze.Driver.pfnGet) {
                if (driver.initStatus != ZE_RESULT_SUCCESS || !driver.legacyInitAttempted) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeInit returned ";
                        debug_trace_message(message, loader::to_string(driver.initStatus));
                    }
                    continue;
                }
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " using zeDriverGet";
                    debug_trace_message(message, "");
                }
                res = driver.dditable.ze.Driver.pfnGet(&pCount, nullptr);
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driverHandles.resize(pCount);
                res = driver.dditable.ze.Driver.pfnGet(&pCount, driverHandles.data());
                // Verify that this driver successfully init in the call above.
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " zeDriverGet returning ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
            } else {
                if (debugTraceEnabled) {
                    std::string message = "driverSorting " + driver.name + " zeDriverGet and zeInitDrivers not supported, skipping driver";
                    debug_trace_message(message, loader::to_string(res));
                }
                continue;
            }

            for (auto handle : driverHandles) {
                ze_driver_properties_t properties = {};
                properties.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
                properties.pNext = nullptr;
                ze_result_t res = driver.dditable.ze.Driver.pfnGetProperties(handle, &properties);
                if (res != ZE_RESULT_SUCCESS) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDriverGetProperties returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                driver.properties = properties;
                uint32_t deviceCount = 0;
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, nullptr );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                if (deviceCount == 0) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned 0 devices";
                        debug_trace_message(message, "");
                    }
                    continue;
                }
                std::vector<ze_device_handle_t> deviceHandles(deviceCount);
                res = driver.dditable.ze.Device.pfnGet( handle, &deviceCount, deviceHandles.data() );
                if( ZE_RESULT_SUCCESS != res ) {
                    if (debugTraceEnabled) {
                        std::string message = "driverSorting " + driver.name + " failed, zeDeviceGet returned ";
                        debug_trace_message(message, loader::to_string(res));
                    }
                    continue;
                }
                bool integratedGPU = false;
                bool discreteGPU = false;
                bool other = false;
                for( auto device : deviceHandles ) {
                    ze_device_properties_t deviceProperties = {};
                    deviceProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
                    deviceProperties.pNext = nullptr;
                    res = driver.dditable.ze.Device.pfnGetProperties(device, &deviceProperties);
                    if( ZE_RESULT_SUCCESS != res ) {
                        if (debugTraceEnabled) {
                            std::string message = "driverSorting " + driver.name + " failed, zeDeviceGetProperties returned ";
                            debug_trace_message(message, loader::to_string(res));
                        }
                        continue;
                    }
                    if (deviceProperties.type == ZE_DEVICE_TYPE_GPU) {
                        if (deviceProperties.flags & ZE_DEVICE_PROPERTY_FLAG_INTEGRATED) {
                            integratedGPU = true;
                        } else {
                            discreteGPU = true;
                        }
                    } else {
                        other = true;
                    }
                }
                if (integratedGPU && discreteGPU && other) {
                    driver.driverType = ZEL_DRIVER_TYPE_MIXED;
                } else if (integratedGPU && discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_GPU;
                } else if (integratedGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_INTEGRATED_GPU;
                } else if (discreteGPU) {
                    driver.driverType = ZEL_DRIVER_TYPE_DISCRETE_GPU;
                } else if (other) {
                    driver.driverType = ZEL_DRIVER_TYPE_OTHER;
                }
            }
        }

        // Sort drivers in ascending order of driver type unless ZE_ENABLE_PCI_ID_DEVICE_ORDER, then in decending order with MIXED and OTHER at the end.
        std::sort(drivers->begin(), drivers->end(), driverSortComparator);

        if (debugTraceEnabled) {
            std::string message = "Drivers after sorting:";
            for (const auto& driver : *drivers) {
                message += "\nDriver Type: " + std::to_string(driver.driverType) + " Driver Name: " + driver.name;
            }
            debug_trace_message(message, "");
        }
        return true;
    }